

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar2;
  size_t sVar3;
  uint8_t *puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ptls_hash_context_t **pppVar10;
  size_t sVar11;
  size_t sVar12;
  
  iVar7 = (*emitter->begin_message)(emitter);
  if (iVar7 != 0) {
    return iVar7;
  }
  buf = emitter->buf;
  ppVar2 = tls->key_schedule;
  sVar3 = buf->off;
  iVar7 = ptls_buffer_reserve(buf,1);
  if (iVar7 == 0) {
    buf->base[buf->off] = '\x14';
    buf->off = buf->off + 1;
    iVar7 = 0;
  }
  bVar6 = true;
  if (iVar7 == 0) {
    iVar7 = ptls_buffer_reserve(buf,3);
    if (iVar7 == 0) {
      puVar4 = buf->base;
      sVar11 = buf->off;
      puVar4[sVar11 + 2] = '\0';
      puVar4 = puVar4 + sVar11;
      puVar4[0] = '\0';
      puVar4[1] = '\0';
      buf->off = buf->off + 3;
      iVar7 = 0;
    }
    bVar6 = true;
    if (iVar7 == 0) {
      sVar11 = buf->off;
      iVar7 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
      if ((iVar7 == 0) &&
         (iVar7 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                   &(tls->traffic_protection).enc), iVar7 == 0)) {
        psVar1 = &emitter->buf->off;
        *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
        uVar8 = buf->off - sVar11;
        lVar9 = 0x10;
        do {
          buf->base[sVar11 - 3] = (uint8_t)(uVar8 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          sVar11 = sVar11 + 1;
        } while (lVar9 != -8);
        bVar5 = true;
        iVar7 = 0;
        bVar6 = false;
      }
      else {
        bVar5 = false;
        bVar6 = true;
      }
    }
    else {
      bVar5 = false;
    }
    if (((bVar5) && (bVar6 = false, ppVar2 != (ptls_key_schedule_t *)0x0)) &&
       (ppVar2->num_hashes != 0)) {
      puVar4 = buf->base;
      sVar11 = buf->off;
      pppVar10 = &ppVar2->hashes[0].ctx;
      sVar12 = 0;
      do {
        (*(*pppVar10)->update)(*pppVar10,puVar4 + sVar3,sVar11 - sVar3);
        sVar12 = sVar12 + 1;
        pppVar10 = pppVar10 + 2;
      } while (sVar12 != ppVar2->num_hashes);
      bVar6 = false;
    }
  }
  if (bVar6) {
    return iVar7;
  }
  iVar7 = (*emitter->commit_message)(emitter);
  return iVar7;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}